

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O2

bool __thiscall cmSourceFile::FindFullPath(cmSourceFile *this,string *error)

{
  char **ppcVar1;
  string *psVar2;
  cmMakefile *pcVar3;
  bool bVar4;
  bool bVar5;
  char *pcVar6;
  ostream *poVar7;
  pointer pbVar8;
  char **local_220;
  string missing;
  char *tryDirs [3];
  string local_1c8;
  ostringstream e;
  size_type local_1a0;
  
  if (this->FindFullPathFailed == false) {
    std::__cxx11::string::string((string *)&e,"GENERATED",(allocator *)&missing);
    bVar4 = GetPropertyAsBool(this,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    if (bVar4) {
      cmSourceFileLocation::DirectoryUseBinary(&this->Location);
      psVar2 = &this->FullPath;
      std::__cxx11::string::_M_assign((string *)psVar2);
      std::__cxx11::string::append((char *)psVar2);
      std::__cxx11::string::append((string *)psVar2);
      bVar4 = true;
    }
    else {
      pcVar3 = (this->Location).Makefile;
      tryDirs[2] = (char *)0x0;
      tryDirs[0] = (char *)0x0;
      tryDirs[1] = (char *)0x0;
      if ((this->Location).AmbiguousDirectory == true) {
        pcVar6 = cmMakefile::GetCurrentSourceDirectory(pcVar3);
        tryDirs[0] = pcVar6;
        tryDirs[1] = cmMakefile::GetCurrentBinaryDirectory(pcVar3);
      }
      else {
        pcVar6 = "";
        tryDirs[0] = "";
      }
      psVar2 = &(this->Location).Directory;
      local_220 = tryDirs;
      while (bVar4 = pcVar6 != (char *)0x0, bVar4) {
        std::__cxx11::string::string((string *)&e,(string *)psVar2);
        if (local_1a0 != 0) {
          std::__cxx11::string::append((char *)&e);
        }
        std::__cxx11::string::append((string *)&e);
        cmsys::SystemTools::CollapseFullPath(&missing,(string *)&e,*local_220);
        std::__cxx11::string::operator=((string *)&e,(string *)&missing);
        std::__cxx11::string::~string((string *)&missing);
        std::__cxx11::string::string((string *)&missing,"",(allocator *)&local_1c8);
        bVar5 = TryFullPath(this,(string *)&e,&missing);
        std::__cxx11::string::~string((string *)&missing);
        if (bVar5) {
LAB_002afcb8:
          std::__cxx11::string::~string((string *)&e);
          return bVar4;
        }
        pbVar8 = (pcVar3->SourceFileExtensions).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        while (pbVar8 != (pcVar3->SourceFileExtensions).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish) {
          bVar5 = TryFullPath(this,(string *)&e,pbVar8);
          pbVar8 = pbVar8 + 1;
          if (bVar5) goto LAB_002afcb8;
        }
        pbVar8 = (pcVar3->HeaderFileExtensions).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        while (pbVar8 != (pcVar3->HeaderFileExtensions).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish) {
          bVar5 = TryFullPath(this,(string *)&e,pbVar8);
          pbVar8 = pbVar8 + 1;
          if (bVar5) goto LAB_002afcb8;
        }
        std::__cxx11::string::~string((string *)&e);
        ppcVar1 = local_220 + 1;
        local_220 = local_220 + 1;
        pcVar6 = *ppcVar1;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      std::__cxx11::string::string((string *)&missing,(string *)psVar2);
      if (missing._M_string_length != 0) {
        std::__cxx11::string::append((char *)&missing);
      }
      std::__cxx11::string::append((string *)&missing);
      poVar7 = std::operator<<((ostream *)&e,"Cannot find source file:\n  ");
      poVar7 = std::operator<<(poVar7,(string *)&missing);
      std::operator<<(poVar7,"\nTried extensions");
      for (pbVar8 = (pcVar3->SourceFileExtensions).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar8 != (pcVar3->SourceFileExtensions).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar8 = pbVar8 + 1) {
        poVar7 = std::operator<<((ostream *)&e," .");
        std::operator<<(poVar7,(string *)pbVar8);
      }
      for (pbVar8 = (pcVar3->HeaderFileExtensions).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar8 != (pcVar3->HeaderFileExtensions).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar8 = pbVar8 + 1) {
        poVar7 = std::operator<<((ostream *)&e," .");
        std::operator<<(poVar7,(string *)pbVar8);
      }
      if (error == (string *)0x0) {
        pcVar3 = (this->Location).Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,&local_1c8);
      }
      else {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)error,(string *)&local_1c8);
      }
      std::__cxx11::string::~string((string *)&local_1c8);
      this->FindFullPathFailed = true;
      std::__cxx11::string::~string((string *)&missing);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool cmSourceFile::FindFullPath(std::string* error)
{
  // If thie method has already failed once do not try again.
  if(this->FindFullPathFailed)
    {
    return false;
    }

  // If the file is generated compute the location without checking on
  // disk.
  if(this->GetPropertyAsBool("GENERATED"))
    {
    // The file is either already a full path or is relative to the
    // build directory for the target.
    this->Location.DirectoryUseBinary();
    this->FullPath = this->Location.GetDirectory();
    this->FullPath += "/";
    this->FullPath += this->Location.GetName();
    return true;
    }

  // The file is not generated.  It must exist on disk.
  cmMakefile const* mf = this->Location.GetMakefile();
  const char* tryDirs[3] = {0, 0, 0};
  if(this->Location.DirectoryIsAmbiguous())
    {
    tryDirs[0] = mf->GetCurrentSourceDirectory();
    tryDirs[1] = mf->GetCurrentBinaryDirectory();
    }
  else
    {
    tryDirs[0] = "";
    }
  const std::vector<std::string>& srcExts = mf->GetSourceExtensions();
  const std::vector<std::string>& hdrExts = mf->GetHeaderExtensions();
  for(const char* const* di = tryDirs; *di; ++di)
    {
    std::string tryPath = this->Location.GetDirectory();
    if(!tryPath.empty())
      {
      tryPath += "/";
      }
    tryPath += this->Location.GetName();
    tryPath = cmSystemTools::CollapseFullPath(tryPath, *di);
    if(this->TryFullPath(tryPath, ""))
      {
      return true;
      }
    for(std::vector<std::string>::const_iterator ei = srcExts.begin();
        ei != srcExts.end(); ++ei)
      {
      if(this->TryFullPath(tryPath, *ei))
        {
        return true;
        }
      }
    for(std::vector<std::string>::const_iterator ei = hdrExts.begin();
        ei != hdrExts.end(); ++ei)
      {
      if(this->TryFullPath(tryPath, *ei))
        {
        return true;
        }
      }
    }

  std::ostringstream e;
  std::string missing = this->Location.GetDirectory();
  if(!missing.empty())
    {
    missing += "/";
    }
  missing += this->Location.GetName();
  e << "Cannot find source file:\n  " << missing << "\nTried extensions";
  for(std::vector<std::string>::const_iterator ext = srcExts.begin();
      ext != srcExts.end(); ++ext)
    {
    e << " ." << *ext;
    }
  for(std::vector<std::string>::const_iterator ext = hdrExts.begin();
      ext != hdrExts.end(); ++ext)
    {
    e << " ." << *ext;
    }
  if(error)
    {
    *error = e.str();
    }
  else
    {
    this->Location.GetMakefile()->IssueMessage(cmake::FATAL_ERROR, e.str());
    }
  this->FindFullPathFailed = true;
  return false;
}